

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault.cc
# Opt level: O3

void __thiscall kratos::FaultAnalyzer::FaultAnalyzer(FaultAnalyzer *this,Generator *generator)

{
  this->generator_ = generator;
  (this->runs_).
  super__Vector_base<std::shared_ptr<kratos::SimulationRun>,_std::allocator<std::shared_ptr<kratos::SimulationRun>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->runs_).
  super__Vector_base<std::shared_ptr<kratos::SimulationRun>,_std::allocator<std::shared_ptr<kratos::SimulationRun>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->runs_).
  super__Vector_base<std::shared_ptr<kratos::SimulationRun>,_std::allocator<std::shared_ptr<kratos::SimulationRun>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->coverage_maps_)._M_h._M_buckets = &(this->coverage_maps_)._M_h._M_single_bucket;
  (this->coverage_maps_)._M_h._M_bucket_count = 1;
  (this->coverage_maps_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->coverage_maps_)._M_h._M_element_count = 0;
  (this->coverage_maps_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->coverage_maps_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->coverage_maps_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

FaultAnalyzer::FaultAnalyzer(kratos::Generator *generator) : generator_(generator) {}